

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O2

bool bsim::signed_gt(quad_value_bit_vector *a,quad_value_bit_vector *b)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  byte bVar4;
  ulong in_RCX;
  uint uVar5;
  quad_value local_3c;
  quad_value local_3b;
  quad_value local_3a;
  quad_value local_39;
  quad_value local_38;
  quad_value local_37;
  quad_value local_36;
  quad_value local_35;
  quad_value local_34;
  quad_value local_33;
  quad_value local_32;
  quad_value local_31;
  
  bVar3 = quad_value_bit_vector::is_binary(a);
  if ((!bVar3) || (bVar3 = quad_value_bit_vector::is_binary(b), !bVar3)) {
    return false;
  }
  iVar1 = a->N;
  if (iVar1 != b->N) {
    __assert_fail("a.bitLength() == b.bitLength()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                  ,0x388,
                  "bool bsim::signed_gt(const quad_value_bit_vector &, const quad_value_bit_vector &)"
                 );
  }
  local_31.value =
       (a->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
       super__Vector_impl_data._M_start[(long)iVar1 + -1].value;
  local_32.value = '\x01';
  bVar3 = operator==(&local_31,&local_32);
  if (bVar3) {
    local_33.value =
         (b->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
         super__Vector_impl_data._M_start[(long)iVar1 + -1].value;
    local_34.value = '\0';
    bVar3 = operator==(&local_33,&local_34);
    if (bVar3) {
      return false;
    }
  }
  local_35.value =
       (b->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
       super__Vector_impl_data._M_start[(long)iVar1 + -1].value;
  local_36.value = '\x01';
  bVar3 = operator==(&local_35,&local_36);
  if (bVar3) {
    local_37.value =
         (a->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
         super__Vector_impl_data._M_start[(long)iVar1 + -1].value;
    local_38.value = '\0';
    bVar3 = operator==(&local_37,&local_38);
    in_RCX = (ulong)bVar3;
    if (bVar3) {
      return true;
    }
  }
  uVar2 = iVar1 - 2;
  do {
    uVar5 = uVar2;
    bVar4 = (byte)in_RCX;
    if ((int)uVar5 < 0) goto LAB_0017fb96;
    local_39.value =
         (a->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
         super__Vector_impl_data._M_start[uVar5].value;
    local_3a.value =
         (b->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
         super__Vector_impl_data._M_start[uVar5].value;
    bVar3 = operator>(&local_39,&local_3a);
    if (bVar3) {
      bVar4 = 1;
      goto LAB_0017fb96;
    }
    local_3b.value =
         (a->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
         super__Vector_impl_data._M_start[uVar5].value;
    local_3c.value =
         (b->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>._M_impl.
         super__Vector_impl_data._M_start[uVar5].value;
    bVar3 = operator<(&local_3b,&local_3c);
    uVar2 = uVar5 - 1;
  } while (!bVar3);
  bVar4 = 0;
LAB_0017fb96:
  return (bool)(-1 < (int)uVar5 & bVar4);
}

Assistant:

static inline bool
  signed_gt(const quad_value_bit_vector& a,
	    const quad_value_bit_vector& b) {

    if (!a.is_binary() || !b.is_binary()) {
      return false;
    }
    
    assert(a.bitLength() == b.bitLength());

    int N = a.bitLength();

    // a negative b non-negative
    if ((a.get(N - 1) == 1) && (b.get(N - 1) == 0)) {
      return false;
    }

    // b negative a non-negative
    if ((b.get(N - 1) == 1) && (a.get(N - 1) == 0)) {
      return true;
    }

    // Both negative or both non-negative
    //if ((a.get(N - 1) == 1) && (b.get(N - 1) == 1)) {

    for (int i = N - 2; i >= 0; i--) {
      if (a.get(i) > b.get(i)) {
  	return true;
      }

      if (a.get(i) < b.get(i)) {
  	return false;
      }
    }

    return false;

  }